

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VInvTestLocal(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  sunrealtype sVar8;
  
  if (param_3 < 2) {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length must be >= 2\n",param_3);
    iVar2 = 1;
  }
  else {
    set_element_range(X,0,param_3 + -1,1.0 / (double)(myid + 2));
    N_VConst(0,Z);
    dVar6 = get_time();
    iVar2 = N_VInvTestLocal(X,Z);
    sync_device(X);
    dVar7 = get_time();
    iVar3 = check_ans((double)(myid + 2),Z,param_3);
    if ((iVar3 == 0) && (iVar2 != 0)) {
      iVar2 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VInvTestLocal Case 1");
      }
    }
    else {
      iVar2 = 1;
      printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n",(ulong)(uint)myid);
    }
    max_time(X,dVar7 - dVar6);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VInvTestLocal");
    }
    N_VConst(0,Z);
    for (uVar4 = 0; param_3 != uVar4; uVar4 = uVar4 + 1) {
      sVar8 = 0.0;
      if ((uVar4 & 1) != 0) {
        sVar8 = 0.5;
      }
      set_element(X,uVar4,sVar8);
    }
    dVar6 = get_time();
    iVar3 = N_VInvTestLocal(X,Z);
    sync_device(X);
    bVar1 = false;
    dVar7 = get_time();
    for (uVar4 = 0; param_3 != uVar4; uVar4 = uVar4 + 1) {
      sVar8 = get_element(Z,uVar4);
      if ((uVar4 & 1) == 0) {
        bVar5 = sVar8 == 0.0;
      }
      else {
        bVar5 = sVar8 == 2.0;
      }
      if ((!bVar5) || (NAN(sVar8))) {
        bVar1 = true;
      }
    }
    if (bVar1 || iVar3 != 0) {
      printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n",(ulong)(uint)myid);
      iVar2 = iVar2 + 1;
    }
    else if (myid == 0) {
      puts("PASSED test -- N_VInvTestLocal Case 2");
    }
    max_time(X,dVar7 - dVar6);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VInvTestLocal");
    }
  }
  return iVar2;
}

Assistant:

int Test_N_VInvTestLocal(N_Vector X, N_Vector Z, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype xval;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 2)
  {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length "
           "must be >= 2\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: All elements Nonzero, z[i] = 1/x[i], return True
   */

  /* fill vector data */
  xval = ONE / (myid + 2);
  set_element_range(X, 0, local_length - 1, xval);
  N_VConst(ZERO, Z);

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of myid+2 */
  failure = check_ans(myid + 2, Z, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 1\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  /*
   * Case 2: Some elements Zero, z[i] = 1/x[i] for x[i] != 0, return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(ZERO, Z);
  for (i = 0; i < local_length; i++)
  {
    if (i % 2) { set_element(X, i, HALF); }
    else { set_element(X, i, ZERO); }
  }

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    if (i % 2)
    {
      if (get_element(Z, i) != TWO) { failure = 1; }
    }
    else
    {
      if (get_element(Z, i) != ZERO) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 2\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  return (fails);
}